

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getShortRangePotential(Snapshot *this)

{
  double dVar1;
  
  if (this->hasShortRangePotential == true) {
    return (this->frameData).shortRangePotential;
  }
  dVar1 = (this->frameData).bondPotential + (this->frameData).bendPotential +
          (this->frameData).torsionPotential + (this->frameData).inversionPotential;
  (this->frameData).shortRangePotential = dVar1;
  this->hasShortRangePotential = true;
  this->hasPotentialEnergy = false;
  this->hasTotalEnergy = false;
  return dVar1;
}

Assistant:

RealType Snapshot::getShortRangePotential() {
    if (!hasShortRangePotential) {
      frameData.shortRangePotential = frameData.bondPotential;
      frameData.shortRangePotential += frameData.bendPotential;
      frameData.shortRangePotential += frameData.torsionPotential;
      frameData.shortRangePotential += frameData.inversionPotential;
      hasShortRangePotential = true;
      hasPotentialEnergy     = false;
      hasTotalEnergy         = false;
    }
    return frameData.shortRangePotential;
  }